

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  char cVar1;
  ssl_connect_state sVar2;
  curl_proxytype cVar3;
  uchar *puVar4;
  ENGINE *e;
  curl_ssl_ctx_callback p_Var5;
  X509 *pXVar6;
  _Bool _Var7;
  char cVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  CURLcode CVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  time_t timeout_ms;
  uint *puVar16;
  ulong uVar17;
  long lVar18;
  SSL_CIPHER *c;
  char *pcVar19;
  timediff_t tVar20;
  SSL_METHOD *meth;
  SSL_CTX *pSVar21;
  SSL_SESSION *pSVar22;
  BIO_METHOD *pBVar23;
  stack_st_X509 *psVar24;
  BIO *pBVar25;
  X509 *pXVar26;
  X509_NAME *pXVar27;
  size_t sVar28;
  undefined8 uVar29;
  ASN1_INTEGER *pAVar30;
  ASN1_STRING *pAVar31;
  X509_EXTENSION *ex;
  BIO *out;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar32;
  EVP_PKEY *pEVar33;
  X509 *pXVar34;
  GENERAL_NAMES *a_00;
  int *piVar35;
  undefined8 *puVar36;
  undefined8 extraout_RAX;
  PKCS12 *p12;
  X509 *pXVar37;
  X509_NAME_ENTRY *ne;
  ASN1_GENERALIZEDTIME *__dest;
  void *__src;
  size_t uznum;
  Curl_easy *pCVar38;
  X509_PUBKEY *pXVar39;
  SSL_SESSION *pSVar40;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar41;
  OCSP_SINGLERESP *single;
  evp_pkey_st *peVar42;
  rsa_st *r;
  UI_METHOD *method;
  UI_METHOD *pUVar43;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *pSVar44;
  long lVar45;
  undefined7 uVar47;
  Curl_easy *pCVar46;
  curl_socket_t writefd;
  long lVar48;
  size_t size;
  size_t size_00;
  CURLcode CVar49;
  int iVar50;
  long lVar51;
  byte bVar52;
  long lVar53;
  uchar uVar54;
  curl_socket_t readfd0;
  long lVar55;
  Curl_easy *pCVar56;
  long lVar57;
  long lVar58;
  BIGNUM *bn;
  long lVar59;
  Curl_easy *unaff_R12;
  undefined8 *__n;
  ulong uVar60;
  ulong uVar61;
  char *pcVar62;
  bool bVar63;
  ssl_connect_data *connssl;
  BUF_MEM *biomem;
  char *ptr;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  int crl_reason;
  EVP_PKEY *pri;
  in6_addr addr;
  char error_buffer [256];
  X509 *local_a70;
  ASN1_GENERALIZEDTIME *local_a60;
  Curl_easy *local_a58;
  Curl_easy *local_a50;
  ASN1_GENERALIZEDTIME *local_a48;
  BIO *local_a40;
  X509 *local_a38;
  char *local_a30;
  X509 *local_a28;
  SSL_SESSION *local_a20;
  X509 *local_a18;
  Curl_easy *local_a10;
  Curl_easy *local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  ASN1_GENERALIZEDTIME *local_9f0;
  uint local_9e4;
  X509 *local_9e0;
  long local_9d8;
  long local_9d0;
  _Bool *local_9c8;
  X509 *local_9c0;
  SSL_SESSION *local_9b8 [16];
  X509 *local_938;
  X509 *local_930;
  X509 local_838 [2];
  undefined1 local_638 [1544];
  
  lVar15 = (long)sockindex;
  if (conn->ssl[lVar15].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_a40 = (BIO *)CONCAT44(local_a40._4_4_,sockindex);
  pCVar56 = conn->data;
  local_a28 = (X509 *)CONCAT44(local_a28._4_4_,conn->sock[lVar15]);
  local_a58 = pCVar56;
  local_9d0 = lVar15;
  local_9c8 = done;
  if (conn->ssl[lVar15].connecting_state == ssl_connect_1) {
    tVar20 = Curl_timeleft(pCVar56,(curltime *)0x0,true);
    if (tVar20 < 0) {
LAB_00499c56:
      Curl_failf(pCVar56,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    cVar3 = (conn->http_proxy).proxytype;
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar51 = 0x158, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar51 = 0xd0;
    }
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar18 = 0xb60, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar18 = 0xab0;
    }
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar48 = 0x340, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar48 = 0x2f0;
    }
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar53 = 0xb90, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar53 = 0xae0;
    }
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar55 = 0xb98, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar55 = 0xae8;
    }
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar57 = 0x360, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar57 = 0x310;
    }
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar58 = 0x358, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar58 = 0x308;
    }
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar59 = 0x350, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar59 = 0x300;
    }
    pCVar56 = conn->data;
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (lVar45 = 0xb68, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar45 = 0xab8;
    }
    local_a00 = CONCAT44(local_a00._4_4_,conn->sock[local_9d0]);
    local_a10 = *(Curl_easy **)((conn->chunk).hexbuffer + lVar51 + -0x20);
    uVar17 = *(ulong *)((conn->chunk).hexbuffer + lVar48 + -0x20);
    local_a38 = *(X509 **)((long)pCVar56->sockets + lVar53 + -0x80);
    local_a50 = *(Curl_easy **)((long)pCVar56->sockets + lVar55 + -0x80);
    local_a30 = *(char **)((conn->chunk).hexbuffer + lVar57 + -0x20);
    unaff_R12 = *(Curl_easy **)((conn->chunk).hexbuffer + lVar58 + -0x20);
    bVar9 = (conn->chunk).hexbuffer[lVar59 + -0x20];
    pXVar26 = *(X509 **)((long)pCVar56->sockets + lVar45 + -0x80);
    local_9d8 = lVar15 * 3;
    CVar12 = Curl_ossl_seed(pCVar56);
    if (CVar12 != CURLE_OK) goto LAB_00499c3b;
    local_9f8 = CONCAT44(local_9f8._4_4_,(uint)bVar9);
    *(undefined8 *)((long)pCVar56->sockets + lVar18 + -0x80) = 1;
    local_a08 = unaff_R12;
    local_9e0 = pXVar26;
    if (uVar17 < 8) {
      if ((0xf3UL >> (uVar17 & 0x3f) & 1) == 0) {
        if (uVar17 == 2) {
          pcVar62 = "OpenSSL was built without SSLv2 support";
        }
        else {
          pcVar62 = "OpenSSL was built without SSLv3 support";
        }
        Curl_failf(pCVar56,pcVar62);
        CVar12 = CURLE_NOT_BUILT_IN;
        goto LAB_00499c3b;
      }
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar21 = (SSL_CTX *)(conn->ssl[lVar15].backend)->ctx;
      if (pSVar21 != (SSL_CTX *)0x0) {
        SSL_CTX_free(pSVar21);
      }
      pSVar21 = SSL_CTX_new(meth);
      pXVar26 = local_a38;
      (conn->ssl[lVar15].backend)->ctx = (SSL_CTX *)pSVar21;
      if (pSVar21 == (SSL_CTX *)0x0) {
        uVar17 = ERR_peek_error();
        ERR_error_string_n(uVar17,(char *)local_838,0x100);
        Curl_failf(pCVar56,"SSL: couldn\'t create a context: %s",local_838);
LAB_00499f29:
        CVar12 = CURLE_OUT_OF_MEMORY;
      }
      else {
        SSL_CTX_ctrl(pSVar21,0x21,0x10,(void *)0x0);
        if (((pCVar56->set).fdebug != (curl_debug_callback)0x0) && ((pCVar56->set).verbose == true))
        {
          SSL_CTX_set_msg_callback((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx,ssl_tls_trace);
          SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx,0x10,0,conn);
        }
        uVar60 = 0x80024850;
        cVar3 = (conn->http_proxy).proxytype;
        if ((cVar3 == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          cVar1 = (pCVar56->set).proxy_ssl.enable_beast;
        }
        else {
          cVar1 = (pCVar56->set).ssl.enable_beast;
        }
        if (cVar1 == '\0') {
          uVar60 = 0x80024050;
        }
        if (7 < uVar17) goto LAB_00499ffe;
        if ((0xf3UL >> (uVar17 & 0x3f) & 1) == 0) {
          if (uVar17 == 2) {
            uVar17 = uVar60 | 0x3e000000;
          }
          else {
            uVar17 = uVar60 | 0x3c000000;
          }
        }
        else {
          if ((cVar3 != CURLPROXY_HTTPS) ||
             (lVar51 = 0x340, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar51 = 0x2f0;
          }
          lVar51 = *(long *)((conn->chunk).hexbuffer + lVar51 + -0x20);
          if ((cVar3 != CURLPROXY_HTTPS) ||
             (lVar18 = 0x348, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar18 = 0x2f8;
          }
          uVar17 = uVar60 | 0x2000000;
          lVar18 = *(long *)((conn->chunk).hexbuffer + lVar18 + -0x20);
          if (lVar51 == 5) {
LAB_00499eb8:
            uVar17 = uVar17 | 0x4000000;
          }
          else {
            if (lVar51 == 6) {
LAB_00499eb1:
              uVar17 = uVar17 | 0x10000000;
              goto LAB_00499eb8;
            }
            if (lVar51 == 7) {
              SSL_CTX_ctrl((SSL_CTX *)(&conn->ssl[0].backend)[local_9d8]->ctx,0x7c,0x304,(void *)0x0
                          );
              uVar17 = uVar60 | 0xa000000;
              goto LAB_00499eb1;
            }
          }
          if (lVar18 != 0x60000) {
            if (lVar18 != 0x50000) {
              if (lVar18 != 0x40000) goto LAB_0049ae8e;
              uVar17 = uVar17 | 0x10000000;
            }
            uVar17 = uVar17 | 0x8000000;
          }
          uVar17 = uVar17 | 0x20000000;
        }
LAB_0049ae8e:
        SSL_CTX_set_options((conn->ssl[lVar15].backend)->ctx,uVar17);
        if ((conn->bits).tls_enable_npn == true) {
          SSL_CTX_set_next_proto_select_cb
                    ((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx,select_next_proto_cb,conn);
        }
        if ((conn->bits).tls_enable_alpn == true) {
          local_838[0].cert_info._0_1_ = 8;
          local_838[0].cert_info._1_7_ = 0x2e312f70747468;
          local_838[0].sig_alg._0_1_ = 0x31;
          Curl_infof(pCVar56,"ALPN, offering %s\n","http/1.1");
          SSL_CTX_set_alpn_protos((conn->ssl[lVar15].backend)->ctx,local_838,9);
        }
        if (pXVar26 != (X509 *)0x0 || local_a50 != (Curl_easy *)0x0) {
          cVar3 = (conn->http_proxy).proxytype;
          if ((cVar3 != CURLPROXY_HTTPS) ||
             (lVar51 = 0xba0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar51 = 0xaf0;
          }
          if ((cVar3 != CURLPROXY_HTTPS) ||
             (lVar18 = 0xba8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar18 = 0xaf8;
          }
          if ((cVar3 != CURLPROXY_HTTPS) ||
             (lVar48 = 0xbb0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar48 = 0xb00;
          }
          pSVar21 = (SSL_CTX *)(conn->ssl[lVar15].backend)->ctx;
          local_a18 = *(X509 **)((long)pCVar56->sockets + lVar51 + -0x80);
          local_9c0 = *(X509 **)((long)pCVar56->sockets + lVar18 + -0x80);
          pcVar62 = *(char **)((long)pCVar56->sockets + lVar48 + -0x80);
          pCVar46 = conn->data;
          iVar10 = do_file_type((char *)local_a50);
          unaff_R12 = pCVar46;
          if (iVar10 == 0x2a || pXVar26 != (X509 *)0x0) {
            if (pcVar62 != (char *)0x0) {
              SSL_CTX_set_default_passwd_cb_userdata(pSVar21,pcVar62);
              SSL_CTX_set_default_passwd_cb(pSVar21,passwd_callback);
            }
            if (iVar10 < 0x2a) {
              if (iVar10 == 1) {
                iVar10 = SSL_CTX_use_certificate_chain_file(pSVar21,(char *)pXVar26);
                if (iVar10 != 1) {
                  uVar17 = ERR_get_error();
                  ERR_error_string_n(uVar17,(char *)local_838,0x100);
                  pcVar62 = 
                  "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
                  goto LAB_0049b4e2;
                }
LAB_0049b313:
                unaff_R12 = (Curl_easy *)0x0;
LAB_0049bee5:
                pXVar6 = local_9c0;
                iVar10 = do_file_type((char *)local_9c0);
                if (iVar10 < 0x2a) {
                  if (iVar10 == 1) {
                    if ((int)unaff_R12 != 0) goto LAB_0049bf61;
                    if (local_a18 == (X509 *)0x0) {
                      local_a18 = pXVar26;
                    }
                  }
                  else if (iVar10 != 2) {
LAB_0049bf25:
                    pcVar62 = "not supported file type for private key";
                    goto LAB_0049c2b2;
                  }
                  iVar10 = SSL_CTX_use_PrivateKey_file(pSVar21,(char *)local_a18,iVar10);
                  if (iVar10 != 1) {
                    pXVar37 = (X509 *)"PEM";
                    if (pXVar6 != (X509 *)0x0) {
                      pXVar37 = pXVar6;
                    }
                    pcVar62 = "unable to set private key file: \'%s\' type %s";
                    pXVar26 = local_a18;
LAB_0049c191:
                    Curl_failf(pCVar46,pcVar62,pXVar26,pXVar37);
                    pCVar46 = unaff_R12;
                    goto LAB_0049c2b9;
                  }
                }
                else {
                  if (iVar10 == 0x2a) {
                    if (((local_a18 != (X509 *)0x0) && ((pCVar46->state).engine == (void *)0x0)) &&
                       (iVar10 = Curl_strncasecompare((char *)local_a18,"pkcs11:",7), iVar10 != 0))
                    {
                      CVar12 = Curl_ossl_set_engine(pCVar46,"pkcs11");
                      iVar10 = 1;
                      if (CVar12 != CURLE_OK) goto LAB_0049c2bf;
                    }
                    if ((pCVar46->state).engine == (void *)0x0) {
                      pcVar62 = "crypto engine not set, can\'t load private key";
                    }
                    else {
                      method = UI_create_method("curl user interface");
                      if (method == (UI_METHOD *)0x0) {
                        pcVar62 = "unable do create OpenSSL user-interface method";
                      }
                      else {
                        pUVar43 = UI_OpenSSL();
                        iVar10 = UI_method_get_opener((UI *)pUVar43);
                        UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar10));
                        pUVar43 = UI_OpenSSL();
                        iVar10 = UI_method_get_closer((UI *)pUVar43);
                        UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar10));
                        UI_method_set_reader(method,ssl_ui_reader);
                        UI_method_set_writer(method,ssl_ui_writer);
                        pEVar33 = ENGINE_load_private_key
                                            ((ENGINE *)(pCVar46->state).engine,(char *)local_a18,
                                             method,pcVar62);
                        UI_destroy_method(method);
                        if (pEVar33 != (EVP_PKEY *)0x0) {
                          iVar10 = SSL_CTX_use_PrivateKey(pSVar21,pEVar33);
                          if (iVar10 != 1) {
                            Curl_failf(pCVar46,"unable to set private key");
                            EVP_PKEY_free(pEVar33);
                            pCVar46 = unaff_R12;
                            goto LAB_0049c2b9;
                          }
                          EVP_PKEY_free(pEVar33);
                          goto LAB_0049bf61;
                        }
                        pcVar62 = "failed to load private key from crypto engine";
                      }
                    }
                    goto LAB_0049c2b2;
                  }
                  if (iVar10 != 0x2b) goto LAB_0049bf25;
                  if ((int)unaff_R12 == 0) {
                    pcVar62 = "file type P12 for private key not supported";
                    goto LAB_0049c2b2;
                  }
                }
LAB_0049bf61:
                pSVar44 = SSL_new(pSVar21);
                if (pSVar44 == (SSL *)0x0) {
                  pcVar62 = "unable to create an SSL structure";
                  goto LAB_0049c2b2;
                }
                local_938 = SSL_get_certificate(pSVar44);
                if (local_938 != (X509 *)0x0) {
                  pEVar33 = X509_get_pubkey(local_938);
                  peVar42 = SSL_get_privatekey(pSVar44);
                  EVP_PKEY_copy_parameters(pEVar33,peVar42);
                  EVP_PKEY_free(pEVar33);
                }
                peVar42 = SSL_get_privatekey(pSVar44);
                iVar10 = EVP_PKEY_get_id(peVar42);
                if (iVar10 == 6) {
                  r = EVP_PKEY_get1_RSA(peVar42);
                  uVar11 = RSA_flags(r);
                  RSA_free(r);
                  SSL_free(pSVar44);
                  if ((uVar11 & 1) == 0) goto LAB_0049c14e;
                }
                else {
                  SSL_free(pSVar44);
LAB_0049c14e:
                  iVar10 = SSL_CTX_check_private_key(pSVar21);
                  if (iVar10 == 0) {
                    pcVar62 = "Private key does not match the certificate public key";
                    goto LAB_0049c2b2;
                  }
                }
                iVar10 = 0;
              }
              else {
                if (iVar10 == 2) {
                  iVar10 = SSL_CTX_use_certificate_file(pSVar21,(char *)pXVar26,2);
                  if (iVar10 == 1) goto LAB_0049b313;
                  uVar17 = ERR_get_error();
                  ERR_error_string_n(uVar17,(char *)local_838,0x100);
                  pcVar62 = 
                  "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
LAB_0049b4e2:
                  pCVar38 = (Curl_easy *)local_838;
                }
                else {
LAB_0049b2e9:
                  pcVar62 = "not supported file type \'%s\' for certificate";
                  pCVar38 = local_a50;
                }
                Curl_failf(pCVar46,pcVar62,pCVar38);
LAB_0049c2b9:
                iVar10 = 1;
                unaff_R12 = pCVar46;
              }
            }
            else {
              if (iVar10 == 0x2a) {
                if (((pXVar26 != (X509 *)0x0) && ((pCVar46->state).engine == (void *)0x0)) &&
                   (iVar10 = Curl_strncasecompare((char *)pXVar26,"pkcs11:",7), iVar10 != 0)) {
                  CVar12 = Curl_ossl_set_engine(pCVar46,"pkcs11");
                  iVar10 = 1;
                  if (CVar12 != CURLE_OK) goto LAB_0049c2bf;
                }
                e = (ENGINE *)(pCVar46->state).engine;
                if (e == (ENGINE *)0x0) {
                  pcVar62 = "crypto engine not set, can\'t load certificate";
                }
                else {
                  local_938 = pXVar26;
                  local_930 = (X509 *)0x0;
                  iVar10 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
                  if (iVar10 == 0) {
                    pcVar62 = "ssl engine does not support loading certificates";
                  }
                  else {
                    iVar10 = ENGINE_ctrl_cmd((ENGINE *)(pCVar46->state).engine,"LOAD_CERT_CTRL",0,
                                             &local_938,(f *)0x0,1);
                    if (iVar10 == 0) {
                      uVar17 = ERR_get_error();
                      pXVar37 = local_838;
                      ERR_error_string_n(uVar17,(char *)pXVar37,0x100);
                      pcVar62 = "ssl engine cannot load client cert with id \'%s\' [%s]";
                      goto LAB_0049c191;
                    }
                    if (local_930 != (X509 *)0x0) {
                      iVar10 = SSL_CTX_use_certificate(pSVar21,local_930);
                      if (iVar10 == 1) {
                        X509_free(local_930);
                        goto LAB_0049b313;
                      }
                      Curl_failf(pCVar46,"unable to set client certificate");
                      X509_free(local_930);
                      goto LAB_0049c2b9;
                    }
                    pcVar62 = "ssl engine didn\'t initialized the certificate properly.";
                  }
                }
LAB_0049c2b2:
                Curl_failf(pCVar46,pcVar62);
                pCVar46 = unaff_R12;
                goto LAB_0049c2b9;
              }
              if (iVar10 != 0x2b) goto LAB_0049b2e9;
              local_a60 = (ASN1_GENERALIZEDTIME *)0x0;
              pBVar23 = BIO_s_file();
              pBVar25 = BIO_new(pBVar23);
              if (pBVar25 == (BIO *)0x0) {
                uVar17 = ERR_get_error();
                pXVar37 = local_838;
                ERR_error_string_n(uVar17,(char *)pXVar37,0x100);
                pcVar19 = "BIO_new return NULL, OpenSSL error %s";
LAB_0049bece:
                Curl_failf(pCVar46,pcVar19,pXVar37);
LAB_0049bed5:
                unaff_R12 = (Curl_easy *)0x0;
                iVar10 = 1;
              }
              else {
                lVar51 = BIO_ctrl(pBVar25,0x6c,3,pXVar26);
                if ((int)lVar51 < 1) {
                  Curl_failf(pCVar46,"could not open PKCS12 file \'%s\'",pXVar26);
                  BIO_free(pBVar25);
                  goto LAB_0049bed5;
                }
                p12 = d2i_PKCS12_bio(pBVar25,(PKCS12 **)0x0);
                BIO_free(pBVar25);
                if (p12 == (PKCS12 *)0x0) {
                  pcVar19 = "error reading PKCS12 file \'%s\'";
                  pXVar37 = pXVar26;
                  goto LAB_0049bece;
                }
                PKCS12_PBE_add();
                iVar10 = PKCS12_parse(p12,pcVar62,(EVP_PKEY **)local_9b8,&local_938,
                                      (stack_st_X509 **)&local_a60);
                if (iVar10 == 0) {
                  uVar17 = ERR_get_error();
                  ERR_error_string_n(uVar17,(char *)local_838,0x100);
                  Curl_failf(pCVar46,"could not parse PKCS12 file, check password, OpenSSL error %s"
                             ,local_838);
                  PKCS12_free(p12);
                  goto LAB_0049bed5;
                }
                PKCS12_free(p12);
                iVar10 = SSL_CTX_use_certificate(pSVar21,local_938);
                if (iVar10 == 1) {
                  iVar10 = SSL_CTX_use_PrivateKey(pSVar21,(EVP_PKEY *)local_9b8[0]);
                  if (iVar10 != 1) {
                    pcVar19 = "unable to use private key from PKCS12 file \'%s\'";
                    pXVar37 = local_a38;
                    pXVar26 = local_a38;
                    goto LAB_0049c8f2;
                  }
                  iVar10 = SSL_CTX_check_private_key(pSVar21);
                  pXVar26 = local_a38;
                  if (iVar10 == 0) {
                    pcVar19 = 
                    "private key from PKCS12 file \'%s\' does not match certificate in same file";
                    pXVar37 = local_a38;
                    goto LAB_0049c8f2;
                  }
                  if (local_a60 == (ASN1_GENERALIZEDTIME *)0x0) {
                    bVar63 = false;
                    goto LAB_0049c8fc;
                  }
                  do {
                    iVar10 = OPENSSL_sk_num(local_a60);
                    bVar63 = iVar10 != 0;
                    if (iVar10 == 0) goto LAB_0049c8fc;
                    pXVar37 = (X509 *)OPENSSL_sk_pop(local_a60);
                    iVar10 = SSL_CTX_add_client_CA(pSVar21,pXVar37);
                    pcVar19 = "cannot add certificate to client CA list";
                    if (iVar10 == 0) {
LAB_0049b1f4:
                      X509_free(pXVar37);
                      Curl_failf(pCVar46,pcVar19);
                      iVar10 = 3;
                    }
                    else {
                      iVar10 = 0;
                      lVar51 = SSL_CTX_ctrl(pSVar21,0xe,0,pXVar37);
                      pcVar19 = "cannot add certificate to certificate chain";
                      if (lVar51 == 0) goto LAB_0049b1f4;
                    }
                  } while (iVar10 == 0);
                  bVar63 = true;
                  if (iVar10 == 3) goto LAB_0049c8fc;
                  unaff_R12 = (Curl_easy *)0x0;
                }
                else {
                  uVar17 = ERR_get_error();
                  ERR_error_string_n(uVar17,(char *)local_838,0x100);
                  pcVar19 = "could not load PKCS12 client certificate, OpenSSL error %s";
                  pXVar37 = local_838;
LAB_0049c8f2:
                  Curl_failf(pCVar46,pcVar19,pXVar37);
                  bVar63 = true;
LAB_0049c8fc:
                  EVP_PKEY_free((EVP_PKEY *)local_9b8[0]);
                  X509_free(local_938);
                  OPENSSL_sk_pop_free(local_a60);
                  iVar10 = 2 - (uint)bVar63;
                  unaff_R12 = (Curl_easy *)(ulong)(bVar63 ^ 1);
                }
              }
              if (iVar10 == 2) goto LAB_0049bee5;
            }
LAB_0049c2bf:
            if (iVar10 != 0) {
              CVar12 = CURLE_SSL_CERTPROBLEM;
              goto LAB_00499c3b;
            }
          }
        }
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar51 = 0x380, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar51 = 0x330;
        }
        pcVar62 = *(char **)((conn->chunk).hexbuffer + lVar51 + -0x20);
        if (pcVar62 == (char *)0x0) {
LAB_0049c340:
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar51 = 0x388, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar51 = 0x338;
          }
          pcVar62 = *(char **)((conn->chunk).hexbuffer + lVar51 + -0x20);
          if (pcVar62 != (char *)0x0) {
            iVar10 = SSL_CTX_set_ciphersuites((conn->ssl[lVar15].backend)->ctx,pcVar62);
            if (iVar10 == 0) {
              pcVar19 = "failed setting TLS 1.3 cipher suite: %s";
              goto LAB_0049c43f;
            }
            Curl_infof(pCVar56,"TLS 1.3 cipher selection: %s\n",pcVar62);
          }
          SSL_CTX_set_post_handshake_auth((conn->ssl[lVar15].backend)->ctx,1);
          uVar29 = local_9f8;
          iVar10 = (int)local_9f8;
          if (local_a30 != (char *)0x0 || local_a08 != (Curl_easy *)0x0) {
            iVar50 = SSL_CTX_load_verify_locations
                               ((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx,local_a30,
                                (char *)local_a08);
            if ((iVar50 == 0) && ((char)uVar29 != '\0')) {
              pcVar62 = local_a30;
              if (local_a30 == (char *)0x0) {
                pcVar62 = "none";
              }
              pCVar46 = (Curl_easy *)0x520e53;
              if (local_a08 != (Curl_easy *)0x0) {
                pCVar46 = local_a08;
              }
              Curl_failf(pCVar56,
                         "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                         pcVar62,pCVar46);
              CVar12 = CURLE_SSL_CACERT_BADFILE;
              goto LAB_00499c3b;
            }
            pcVar62 = "error setting certificate verify locations, continuing anyway:\n";
            if (iVar50 != 0) {
              pcVar62 = "successfully set certificate verify locations:\n";
            }
            Curl_infof(pCVar56,pcVar62);
            pcVar62 = local_a30;
            if (local_a30 == (char *)0x0) {
              pcVar62 = "none";
            }
            pCVar46 = (Curl_easy *)0x520e53;
            if (local_a08 != (Curl_easy *)0x0) {
              pCVar46 = local_a08;
            }
            Curl_infof(pCVar56,"  CAfile: %s\n  CApath: %s\n",pcVar62,pCVar46);
          }
          if (local_9e0 != (X509 *)0x0) {
            pXVar41 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx);
            m = X509_LOOKUP_file();
            ctx = X509_STORE_add_lookup(pXVar41,m);
            pXVar26 = local_9e0;
            if ((ctx == (X509_LOOKUP *)0x0) ||
               (iVar10 = X509_load_crl_file(ctx,(char *)local_9e0,1), iVar10 == 0)) {
              Curl_failf(pCVar56,"error loading CRL file: %s",pXVar26);
              CVar12 = CURLE_SSL_CRL_BADFILE;
              goto LAB_00499c3b;
            }
            Curl_infof(pCVar56,"successfully load CRL file:\n");
            pXVar41 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx);
            X509_STORE_set_flags(pXVar41,0xc);
            Curl_infof(pCVar56,"  CRLfile: %s\n",pXVar26);
            iVar10 = (int)local_9f8;
          }
          SSL_CTX_set_verify((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx,iVar10,(callback *)0x0);
          if (keylog_file_fp != (FILE *)0x0) {
            SSL_CTX_set_keylog_callback((conn->ssl[lVar15].backend)->ctx,ossl_keylog_callback);
          }
          p_Var5 = (pCVar56->set).ssl.fsslctx;
          if ((p_Var5 == (curl_ssl_ctx_callback)0x0) ||
             (CVar12 = (*p_Var5)(pCVar56,(conn->ssl[lVar15].backend)->ctx,
                                 (pCVar56->set).ssl.fsslctxp), CVar12 == CURLE_OK)) {
            pSVar44 = (SSL *)(conn->ssl[lVar15].backend)->handle;
            if (pSVar44 != (SSL *)0x0) {
              SSL_free(pSVar44);
            }
            pSVar44 = SSL_new((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx);
            pCVar46 = local_a10;
            (conn->ssl[lVar15].backend)->handle = (SSL *)pSVar44;
            if (pSVar44 == (SSL *)0x0) {
              Curl_failf(pCVar56,"SSL: couldn\'t create a context (handle)!");
              goto LAB_00499f29;
            }
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_0049c631:
                SSL_ctrl(pSVar44,0x41,1,(void *)0x0);
              }
            }
            else if ((conn->ssl_config).verifystatus == true) goto LAB_0049c631;
            SSL_set_connect_state((SSL *)(conn->ssl[lVar15].backend)->handle);
            (conn->ssl[lVar15].backend)->server_cert = (X509 *)0x0;
            iVar10 = inet_pton(2,(char *)pCVar46,&local_938);
            if (((iVar10 == 0) && (iVar10 = inet_pton(10,(char *)pCVar46,&local_938), iVar10 == 0))
               && (lVar51 = SSL_ctrl((SSL *)(conn->ssl[lVar15].backend)->handle,0x37,0,pCVar46),
                  lVar51 == 0)) {
              Curl_infof(pCVar56,
                         "WARNING: failed to configure server name indication (SNI) TLS extension\n"
                        );
            }
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if ((pCVar56->set).proxy_ssl.primary.sessionid != false) {
LAB_0049c733:
                local_9b8[0] = (SSL_SESSION *)0x0;
                Curl_ssl_sessionid_lock(conn);
                _Var7 = Curl_ssl_getsessionid(conn,local_9b8,(size_t *)0x0,(int)local_a40);
                if (_Var7) {
LAB_0049c79a:
                  Curl_ssl_sessionid_unlock(conn);
                  CVar12 = CURLE_SSL_CIPHER;
                  bVar63 = true;
                }
                else {
                  iVar10 = SSL_set_session((SSL *)(conn->ssl[lVar15].backend)->handle,local_9b8[0]);
                  if (iVar10 != 0) {
                    Curl_infof(pCVar56,"SSL re-using session ID\n");
                    goto LAB_0049c79a;
                  }
                  Curl_ssl_sessionid_unlock(conn);
                  uVar17 = ERR_get_error();
                  ERR_error_string_n(uVar17,(char *)local_838,0x100);
                  bVar63 = false;
                  Curl_failf(pCVar56,"SSL: SSL_set_session failed: %s",local_838);
                  CVar12 = CURLE_SSL_CONNECT_ERROR;
                }
                if (!bVar63) goto LAB_00499c3b;
              }
            }
            else if ((pCVar56->set).ssl.primary.sessionid == true) goto LAB_0049c733;
            lVar51 = local_9d8;
            if ((&conn->proxy_ssl[0].use)[local_9d8 * 8] == true) {
              pBVar23 = BIO_f_ssl();
              pBVar25 = BIO_new(pBVar23);
              BIO_ctrl(pBVar25,0x6d,0,(&conn->proxy_ssl[0].backend)[lVar51]->handle);
              SSL_set_bio((SSL *)(conn->ssl[lVar15].backend)->handle,pBVar25,pBVar25);
            }
            else {
              iVar10 = SSL_set_fd((SSL *)(conn->ssl[lVar15].backend)->handle,(int)local_a00);
              if (iVar10 == 0) {
                uVar17 = ERR_get_error();
                ERR_error_string_n(uVar17,(char *)local_838,0x100);
                Curl_failf(pCVar56,"SSL: SSL_set_fd failed: %s",local_838);
                goto LAB_0049a00f;
              }
            }
            conn->ssl[lVar15].connecting_state = ssl_connect_2;
            CVar12 = CURLE_OK;
          }
          else {
            Curl_failf(pCVar56,"error signaled by ssl ctx callback");
          }
        }
        else {
          iVar10 = SSL_CTX_set_cipher_list((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx,pcVar62);
          if (iVar10 != 0) {
            Curl_infof(pCVar56,"Cipher selection: %s\n",pcVar62);
            goto LAB_0049c340;
          }
          pcVar19 = "failed setting cipher list: %s";
LAB_0049c43f:
          Curl_failf(pCVar56,pcVar19,pcVar62);
          CVar12 = CURLE_SSL_CIPHER;
        }
      }
    }
    else {
LAB_00499ffe:
      Curl_failf(pCVar56,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
LAB_0049a00f:
      CVar12 = CURLE_SSL_CONNECT_ERROR;
    }
LAB_00499c3b:
    if (CVar12 != CURLE_OK) {
      return CVar12;
    }
  }
  local_a50 = (Curl_easy *)&(conn->http_proxy).host.name;
  local_a38 = (X509 *)&(conn->host).name;
  pCVar56 = local_a58;
  while (sVar2 = conn->ssl[lVar15].connecting_state, sVar2 - ssl_connect_2 < 3) {
    timeout_ms = Curl_timeleft(pCVar56,(curltime *)0x0,true);
    if (timeout_ms < 0) goto LAB_00499c56;
    sVar2 = conn->ssl[lVar15].connecting_state;
    if ((sVar2 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar2 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_a28;
      }
      readfd0 = -1;
      if (sVar2 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_a28;
      }
      if (nonblocking) {
        timeout_ms = 0;
      }
      iVar10 = Curl_socket_check(readfd0,-1,writefd,timeout_ms);
      if (iVar10 < 0) {
        puVar16 = (uint *)__errno_location();
        bVar63 = false;
        Curl_failf(pCVar56,"select/poll on SSL socket, errno: %d",(ulong)*puVar16);
        unaff_R12 = (Curl_easy *)0x23;
      }
      else {
        bVar63 = true;
        if (iVar10 == 0) {
          if (nonblocking) {
            *local_9c8 = false;
            bVar63 = false;
            unaff_R12 = (Curl_easy *)0x0;
          }
          else {
            bVar63 = false;
            Curl_failf(pCVar56,"SSL connection timeout");
            unaff_R12 = (Curl_easy *)0x1c;
          }
        }
      }
      if (!bVar63) {
        return (CURLcode)unaff_R12;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar51 = 0xb60, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar51 = 0xab0;
    }
    pCVar46 = conn->data;
    ERR_clear_error();
    iVar10 = SSL_connect((SSL *)(conn->ssl[lVar15].backend)->handle);
    if (iVar10 == 1) {
      conn->ssl[lVar15].connecting_state = ssl_connect_3;
      pSVar44 = (SSL *)(conn->ssl[lVar15].backend)->handle;
      pcVar62 = "";
      if (pSVar44 != (SSL *)0x0) {
        iVar10 = SSL_version(pSVar44);
        pcVar62 = "TLSv1.3";
        switch(iVar10) {
        case 0x300:
          pcVar62 = "SSLv3";
          break;
        case 0x301:
          pcVar62 = "TLSv1.0";
          break;
        case 0x302:
          pcVar62 = "TLSv1.1";
          break;
        case 0x303:
          pcVar62 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar10 == 2) {
            pcVar62 = "SSLv2";
          }
          else {
            pcVar62 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)(conn->ssl[lVar15].backend)->handle);
      pcVar19 = SSL_CIPHER_get_name(c);
      CVar49 = CURLE_OK;
      CVar12 = CURLE_OK;
      Curl_infof(pCVar46,"SSL connection using %s / %s\n",pcVar62,pcVar19);
      pCVar56 = local_a58;
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected((conn->ssl[lVar15].backend)->handle,local_838,&local_938);
        pCVar56 = local_a58;
        if ((int)local_938 == 0) {
          Curl_infof(pCVar46,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar46,"ALPN, server accepted to use %.*s\n",(ulong)local_938 & 0xffffffff,
                     CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
          CVar12 = CVar49;
          if (((int)local_938 == 8) &&
             (*(long *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_) ==
              0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      uVar11 = SSL_get_error((SSL *)(conn->ssl[lVar15].backend)->handle,iVar10);
      if (uVar11 == 3) {
        conn->ssl[lVar15].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar11 != 2) {
          memset(local_838,0,0x100);
          conn->ssl[lVar15].connecting_state = ssl_connect_2;
          uVar17 = ERR_get_error();
          uVar14 = (uint)uVar17;
          if ((((int)uVar14 < 0) || ((uVar14 & 0xff800000) != 0xa000000)) ||
             ((uVar14 & 0x7fffff) != 0x86)) {
            ERR_error_string_n(uVar17,(char *)local_838,0x100);
            CVar12 = CURLE_SSL_CONNECT_ERROR;
          }
          else {
            lVar18 = SSL_get_verify_result((SSL *)(conn->ssl[lVar15].backend)->handle);
            if (lVar18 == 0) {
              local_838[0].signature = (ASN1_BIT_STRING *)0x6163696669726576;
              local_838[0]._24_8_ = 0x696166206e6f6974;
              local_838[0].cert_info._0_1_ = 0x53;
              local_838[0].cert_info._1_7_ = 0x74726563204c53;
              local_838[0].sig_alg._0_1_ = 0x69;
              local_838[0].sig_alg._1_7_ = 0x20657461636966;
              local_838[0].name._0_4_ = 0x64656c;
            }
            else {
              *(long *)((long)pCVar46->sockets + lVar51 + -0x80) = lVar18;
              pcVar62 = X509_verify_cert_error_string(lVar18);
              curl_msnprintf((char *)local_838,0x100,"SSL certificate problem: %s",pcVar62);
            }
            CVar12 = CURLE_PEER_FAILED_VERIFICATION;
          }
          if (uVar17 == 0) {
            cVar3 = (conn->http_proxy).proxytype;
            if ((cVar3 != CURLPROXY_HTTPS) ||
               (pCVar38 = local_a50,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              pCVar38 = (Curl_easy *)local_a38;
            }
            if ((cVar3 == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              lVar51 = conn->port;
            }
            else {
              lVar51 = (long)conn->remote_port;
            }
            pcVar62 = "SSL_ERROR unknown";
            if (uVar11 < 0xb) {
              pcVar62 = (&PTR_anon_var_dwarf_1838b3c_006386c8)[uVar11];
            }
            Curl_failf(pCVar46,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar62,
                       *(char **)pCVar38,lVar51);
          }
          else {
            Curl_failf(pCVar46,"%s",local_838);
          }
          goto LAB_004999eb;
        }
        conn->ssl[lVar15].connecting_state = ssl_connect_2_reading;
      }
      CVar12 = CURLE_OK;
    }
LAB_004999eb:
    if (CVar12 != CURLE_OK) {
      return CVar12;
    }
    if ((nonblocking) && (conn->ssl[lVar15].connecting_state - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar2 != ssl_connect_3) goto LAB_0049bd27;
  pCVar56 = conn->data;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    if ((pCVar56->set).proxy_ssl.primary.sessionid == false) goto LAB_0049a063;
LAB_00499f57:
    local_838[0].cert_info._0_1_ = 0;
    local_838[0].cert_info._1_7_ = 0;
    pSVar22 = SSL_get1_session((SSL *)(conn->ssl[lVar15].backend)->handle);
    Curl_ssl_sessionid_lock(conn);
    _Var7 = Curl_ssl_getsessionid(conn,&local_838[0].cert_info,(size_t *)0x0,(int)local_a40);
    if ((_Var7) ||
       ((SSL_SESSION *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_) ==
        pSVar22)) {
      if (_Var7) goto LAB_00499fca;
      SSL_SESSION_free(pSVar22);
LAB_0049a04f:
      Curl_ssl_sessionid_unlock(conn);
      bVar63 = true;
    }
    else {
      Curl_infof(pCVar56,"old SSL session ID is stale, removing\n");
      Curl_ssl_delsessionid
                (conn,(void *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
LAB_00499fca:
      CVar12 = Curl_ssl_addsessionid(conn,pSVar22,0,(int)local_a40);
      if (CVar12 == CURLE_OK) goto LAB_0049a04f;
      pSVar22 = (SSL_SESSION *)(ulong)CVar12;
      Curl_ssl_sessionid_unlock(conn);
      bVar63 = false;
      Curl_failf(pCVar56,"failed to store ssl session");
    }
    CVar12 = (CURLcode)pSVar22;
    if (bVar63) goto LAB_0049a063;
  }
  else {
    if ((pCVar56->set).ssl.primary.sessionid == true) goto LAB_00499f57;
LAB_0049a063:
    cVar3 = (conn->http_proxy).proxytype;
    if ((cVar3 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      cVar1 = (conn->proxy_ssl_config).verifypeer;
    }
    else {
      cVar1 = (conn->ssl_config).verifypeer;
    }
    cVar8 = '\x01';
    if (cVar1 == '\0') {
      if ((cVar3 != CURLPROXY_HTTPS) ||
         (lVar51 = 0x351, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar51 = 0x301;
      }
      cVar8 = (conn->chunk).hexbuffer[lVar51 + -0x20];
    }
    local_a30 = (char *)CONCAT71(local_a30._1_7_,cVar8);
    pCVar56 = conn->data;
    memset(&local_938,0,0x100);
    if ((cVar3 != CURLPROXY_HTTPS) ||
       (local_9d8 = 0xb60, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      local_9d8 = 0xab0;
    }
    pBVar23 = BIO_s_mem();
    local_a50 = (Curl_easy *)BIO_new(pBVar23);
    if ((pCVar56->set).ssl.certinfo == true) {
      pCVar46 = conn->data;
      psVar24 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar15].backend)->handle);
      if (psVar24 != (stack_st_X509 *)0x0) {
        local_a40 = (BIO *)psVar24;
        iVar10 = OPENSSL_sk_num(psVar24);
        CVar12 = Curl_ssl_init_certinfo(pCVar46,iVar10);
        if (CVar12 == CURLE_OK) {
          local_a10 = pCVar56;
          pBVar23 = BIO_s_mem();
          pBVar25 = BIO_new(pBVar23);
          if (0 < iVar10) {
            iVar50 = 0;
            local_a38 = (X509 *)CONCAT44(local_a38._4_4_,iVar10);
            local_a58 = pCVar46;
            do {
              pXVar26 = (X509 *)OPENSSL_sk_value(local_a40,iVar50);
              local_9f0 = (ASN1_GENERALIZEDTIME *)0x0;
              pXVar27 = X509_get_subject_name(pXVar26);
              X509_NAME_print_ex(pBVar25,pXVar27,0,0x82031f);
              sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
              Curl_ssl_push_certinfo_len(pCVar46,iVar50,"Subject",(char *)local_a48,sVar28);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
              pXVar27 = X509_get_issuer_name(pXVar26);
              X509_NAME_print_ex(pBVar25,pXVar27,0,0x82031f);
              sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
              Curl_ssl_push_certinfo_len(pCVar46,iVar50,"Issuer",(char *)local_a48,sVar28);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
              uVar29 = X509_get_version(pXVar26);
              BIO_printf(pBVar25,"%lx",uVar29);
              sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
              Curl_ssl_push_certinfo_len(pCVar46,iVar50,"Version",(char *)local_a48,sVar28);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
              local_a28 = pXVar26;
              pAVar30 = X509_get_serialNumber(pXVar26);
              if (pAVar30->type == 0x102) {
                BIO_puts(pBVar25,"-");
              }
              if (0 < pAVar30->length) {
                lVar51 = 0;
                do {
                  BIO_printf(pBVar25,"%02x",(ulong)pAVar30->data[lVar51]);
                  lVar51 = lVar51 + 1;
                } while (lVar51 < pAVar30->length);
              }
              sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
              pCVar56 = local_a58;
              Curl_ssl_push_certinfo_len(local_a58,iVar50,"Serial Number",(char *)local_a48,sVar28);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
              local_a20 = (SSL_SESSION *)0x0;
              pAVar31 = ASN1_STRING_new();
              if (pAVar31 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_9f0,&local_a20,local_a28);
                X509_signature_print(pBVar25,(X509_ALGOR *)local_a20,pAVar31);
                ASN1_STRING_free(pAVar31);
                if (local_a20 != (SSL_SESSION *)0x0) {
                  i2a_ASN1_OBJECT(pBVar25,*(ASN1_OBJECT **)local_a20);
                  sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
                  Curl_ssl_push_certinfo_len
                            (pCVar56,iVar50,"Public Key Algorithm",(char *)local_a48,sVar28);
                  BIO_ctrl(pBVar25,1,0,(void *)0x0);
                }
              }
              uVar29 = X509_get0_extensions(local_a28);
              iVar10 = OPENSSL_sk_num(uVar29);
              if ((0 < iVar10) && (iVar10 = OPENSSL_sk_num(uVar29), 0 < iVar10)) {
                iVar10 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar29,iVar10);
                  pBVar23 = BIO_s_mem();
                  out = BIO_new(pBVar23);
                  if (out == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)local_9b8,0x80,a);
                  iVar13 = X509V3_EXT_print(out,ex,0,0);
                  if (iVar13 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(out,v);
                  }
                  BIO_ctrl(out,0x73,0,&local_a60);
                  uVar17._0_4_ = local_a60->length;
                  uVar17._4_4_ = local_a60->type;
                  if (uVar17 != 0) {
                    pXVar26 = local_838;
                    uVar60 = 0;
                    do {
                      puVar4 = local_a60->data;
                      pcVar62 = "";
                      if (puVar4[uVar60] == '\n') {
                        pcVar62 = ", ";
                      }
                      uVar60 = (puVar4[uVar60] == '\n') + uVar60;
                      if (uVar60 < uVar17) {
                        uVar54 = puVar4[uVar60];
                        uVar61 = uVar60;
                        while (uVar54 == ' ') {
                          uVar60 = uVar17;
                          if (uVar17 <= uVar61 + 1) goto LAB_0049a563;
                          uVar54 = puVar4[uVar61 + 1];
                          uVar61 = uVar61 + 1;
                        }
                        iVar13 = curl_msnprintf((char *)pXVar26,(size_t)(local_638 + -(long)pXVar26)
                                                ,"%s%c",pcVar62,(ulong)(uint)(int)(char)uVar54);
                        pXVar26 = (X509 *)((long)&pXVar26->cert_info + (long)iVar13);
                        uVar60 = uVar61;
                      }
LAB_0049a563:
                      uVar60 = uVar60 + 1;
                      uVar17._0_4_ = local_a60->length;
                      uVar17._4_4_ = local_a60->type;
                    } while (uVar60 < uVar17);
                  }
                  Curl_ssl_push_certinfo(local_a58,iVar50,(char *)local_9b8,(char *)local_838);
                  BIO_free(out);
                  iVar10 = iVar10 + 1;
                  iVar13 = OPENSSL_sk_num(uVar29);
                } while (iVar10 < iVar13);
              }
              pXVar26 = local_a28;
              pAVar32 = (ASN1_TIME *)X509_get0_notBefore(local_a28);
              ASN1_TIME_print(pBVar25,pAVar32);
              sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
              pCVar56 = local_a58;
              Curl_ssl_push_certinfo_len(local_a58,iVar50,"Start date",(char *)local_a48,sVar28);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
              pAVar32 = (ASN1_TIME *)X509_get0_notAfter(pXVar26);
              ASN1_TIME_print(pBVar25,pAVar32);
              sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
              Curl_ssl_push_certinfo_len(pCVar56,iVar50,"Expire date",(char *)local_a48,sVar28);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
              pEVar33 = X509_get_pubkey(pXVar26);
              if (pEVar33 == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar56,"   Unable to load public key\n");
              }
              else {
                iVar10 = EVP_PKEY_get_id(pEVar33);
                if (iVar10 == 0x74) {
                  uVar29 = EVP_PKEY_get0_DSA(pEVar33);
                  DSA_get0_pqg(uVar29,local_838,local_9b8,&local_a60);
                  DSA_get0_key(uVar29,&local_a20,0);
                  bn = (BIGNUM *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_)
                  ;
                  pcVar62 = "dsa";
LAB_0049a83a:
                  pCVar56 = local_a58;
                  pubkey_show(local_a58,(BIO *)pBVar25,iVar50,pcVar62,"p",bn);
                  pubkey_show(pCVar56,(BIO *)pBVar25,iVar50,pcVar62,"q",(BIGNUM *)local_9b8[0]);
                  pubkey_show(pCVar56,(BIO *)pBVar25,iVar50,pcVar62,"g",(BIGNUM *)local_a60);
                  pcVar19 = "pub_key";
                  pSVar22 = local_a20;
LAB_0049a8a3:
                  pubkey_show(pCVar56,(BIO *)pBVar25,iVar50,pcVar62,pcVar19,(BIGNUM *)pSVar22);
                }
                else {
                  if (iVar10 == 0x1c) {
                    uVar29 = EVP_PKEY_get0_DH(pEVar33);
                    DH_get0_pqg(uVar29,local_838,local_9b8,&local_a60);
                    DH_get0_key(uVar29,&local_a20,0);
                    bn = (BIGNUM *)
                         CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_);
                    pcVar62 = "dh";
                    goto LAB_0049a83a;
                  }
                  if (iVar10 == 6) {
                    uVar29 = EVP_PKEY_get0_RSA(pEVar33);
                    RSA_get0_key(uVar29,local_838,local_9b8,0);
                    BN_print(pBVar25,(BIGNUM *)
                                     CONCAT71(local_838[0].cert_info._1_7_,
                                              local_838[0].cert_info._0_1_));
                    sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
                    pCVar56 = local_a58;
                    Curl_ssl_push_certinfo_len
                              (local_a58,iVar50,"RSA Public Key",(char *)local_a48,sVar28);
                    BIO_ctrl(pBVar25,1,0,(void *)0x0);
                    pubkey_show(pCVar56,(BIO *)pBVar25,iVar50,"rsa","n",
                                (BIGNUM *)
                                CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_))
                    ;
                    pcVar62 = "rsa";
                    pcVar19 = "e";
                    pSVar22 = local_9b8[0];
                    goto LAB_0049a8a3;
                  }
                }
                EVP_PKEY_free(pEVar33);
              }
              if (local_9f0 != (ASN1_GENERALIZEDTIME *)0x0) {
                if (0 < local_9f0->length) {
                  lVar51 = 0;
                  do {
                    BIO_printf(pBVar25,"%02x:",(ulong)local_9f0->data[lVar51]);
                    lVar51 = lVar51 + 1;
                  } while (lVar51 < local_9f0->length);
                }
                sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
                Curl_ssl_push_certinfo_len(local_a58,iVar50,"Signature",(char *)local_a48,sVar28);
                BIO_ctrl(pBVar25,1,0,(void *)0x0);
              }
              PEM_write_bio_X509(pBVar25,local_a28);
              sVar28 = BIO_ctrl(pBVar25,3,0,&local_a48);
              pCVar46 = local_a58;
              Curl_ssl_push_certinfo_len(local_a58,iVar50,"Cert",(char *)local_a48,sVar28);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
              iVar50 = iVar50 + 1;
            } while (iVar50 != (int)local_a38);
          }
          BIO_free(pBVar25);
          pCVar56 = local_a10;
        }
      }
    }
    pBVar23 = BIO_s_file();
    pBVar25 = BIO_new(pBVar23);
    if (pBVar25 == (BIO *)0x0) {
      uVar17 = ERR_get_error();
      ERR_error_string_n(uVar17,(char *)&local_938,0x100);
      Curl_failf(pCVar56,"BIO_new return NULL, OpenSSL error %s",&local_938);
      BIO_free((BIO *)local_a50);
      CVar12 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pXVar34 = (X509 *)SSL_get1_peer_certificate((conn->ssl[lVar15].backend)->handle);
      (conn->ssl[lVar15].backend)->server_cert = pXVar34;
      if (pXVar34 == (X509 *)0x0) {
        BIO_free(pBVar25);
        BIO_free((BIO *)local_a50);
        CVar12 = CURLE_OK;
        if ((char)local_a30 != '\0') {
          Curl_failf(pCVar56,"SSL: couldn\'t get peer certificate!");
          CVar12 = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
      else {
        if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
          pcVar62 = "Proxy";
          if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
            pcVar62 = "Server";
          }
        }
        else {
          pcVar62 = "Server";
        }
        local_a40 = pBVar25;
        Curl_infof(pCVar56,"%s certificate:\n",pcVar62);
        pXVar27 = X509_get_subject_name((X509 *)(conn->ssl[lVar15].backend)->server_cert);
        iVar10 = x509_name_oneline((X509_NAME *)pXVar27,(char *)local_838,size);
        pXVar26 = (X509 *)"[NONE]";
        if (iVar10 == 0) {
          pXVar26 = local_838;
        }
        Curl_infof(pCVar56," subject: %s\n",pXVar26);
        pAVar32 = (ASN1_TIME *)X509_get0_notBefore((conn->ssl[lVar15].backend)->server_cert);
        pCVar46 = local_a50;
        ASN1_TIME_print((BIO *)local_a50,pAVar32);
        lVar51 = BIO_ctrl((BIO *)pCVar46,3,0,&local_a20);
        Curl_infof(pCVar56," start date: %.*s\n",lVar51);
        BIO_ctrl((BIO *)pCVar46,1,0,(void *)0x0);
        pAVar32 = (ASN1_TIME *)X509_get0_notAfter((conn->ssl[lVar15].backend)->server_cert);
        ASN1_TIME_print((BIO *)pCVar46,pAVar32);
        lVar51 = BIO_ctrl((BIO *)pCVar46,3,0,&local_a20);
        Curl_infof(pCVar56," expire date: %.*s\n",lVar51);
        BIO_ctrl((BIO *)pCVar46,1,0,(void *)0x0);
        BIO_free((BIO *)pCVar46);
        cVar3 = (conn->http_proxy).proxytype;
        if ((cVar3 == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          if ((conn->proxy_ssl_config).verifyhost == false) goto LAB_0049b66e;
LAB_0049ac0d:
          if ((cVar3 != CURLPROXY_HTTPS) ||
             (lVar51 = 0x158, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar51 = 0xd0;
          }
          if ((cVar3 != CURLPROXY_HTTPS) ||
             (lVar18 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar18 = 0xd8;
          }
          pXVar26 = (X509 *)(conn->ssl[lVar15].backend)->server_cert;
          local_a50 = conn->data;
          pCVar46 = *(Curl_easy **)((conn->chunk).hexbuffer + lVar51 + -0x20);
          local_a00 = *(undefined8 *)((conn->chunk).hexbuffer + lVar18 + -0x20);
          local_a10 = pCVar56;
          local_a08 = pCVar46;
          if (((conn->bits).ipv6_ip == true) &&
             (iVar10 = inet_pton(10,(char *)pCVar46,local_9b8), iVar10 != 0)) {
            iVar10 = 7;
            local_a38 = (X509 *)0x10;
          }
          else {
            iVar10 = inet_pton(2,(char *)pCVar46,local_9b8);
            local_a38 = (X509 *)(ulong)((uint)(iVar10 != 0) * 4);
            iVar10 = (uint)(iVar10 != 0) * 5 + 2;
          }
          CVar12 = CURLE_OK;
          pXVar37 = (X509 *)0x0;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar26,0x55,(int *)0x0,(int *)0x0);
          local_9e0 = pXVar26;
          if (a_00 == (GENERAL_NAMES *)0x0) {
            bVar9 = 0;
            bVar52 = 0;
          }
          else {
            iVar50 = OPENSSL_sk_num(a_00);
            local_a58 = (Curl_easy *)CONCAT44(local_a58._4_4_,iVar50);
            if (iVar50 < 1) {
              bVar9 = 0;
              bVar52 = 0;
            }
            else {
              iVar50 = 1;
              local_a70 = (X509 *)0x0;
              local_a28 = (X509 *)0x0;
              local_9f8 = 0;
              bVar63 = false;
              do {
                piVar35 = (int *)OPENSSL_sk_value(a_00,iVar50 + -1);
                iVar13 = *piVar35;
                uVar47 = (undefined7)((ulong)pXVar37 >> 8);
                if (iVar13 == 2) {
                  pXVar37 = (X509 *)CONCAT71(uVar47,1);
                  local_a70 = pXVar37;
                }
                else if (iVar13 == 7) {
                  pXVar37 = (X509 *)CONCAT71(uVar47,1);
                  local_a28 = pXVar37;
                }
                if (iVar13 == iVar10) {
                  pXVar26 = (X509 *)ASN1_STRING_get0_data(*(undefined8 *)(piVar35 + 2));
                  iVar13 = ASN1_STRING_length(*(ASN1_STRING **)(piVar35 + 2));
                  __n = (undefined8 *)(long)iVar13;
                  if (iVar10 == 7) {
                    if ((local_a38 == (X509 *)__n) &&
                       (iVar13 = bcmp(pXVar26,local_9b8,(size_t)__n), iVar13 == 0)) {
                      Curl_infof(local_a50,
                                 " subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                                 local_a00);
                      local_9f8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                    }
                  }
                  else if (((iVar10 == 2) &&
                           (puVar36 = (undefined8 *)strlen((char *)pXVar26), puVar36 == __n)) &&
                          (iVar13 = Curl_cert_hostcheck((char *)pXVar26,(char *)local_a08),
                          iVar13 != 0)) {
                    Curl_infof(local_a50," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                               local_a00,pXVar26);
                    bVar63 = true;
                    pXVar37 = pXVar26;
                  }
                }
              } while ((iVar50 < (int)local_a58) && (iVar50 = iVar50 + 1, !bVar63));
              bVar9 = (byte)local_a70 | (byte)local_a28;
              bVar52 = bVar63 | (byte)local_9f8;
            }
            GENERAL_NAMES_free(a_00);
          }
          uVar29 = local_a00;
          pCVar56 = local_a10;
          pCVar46 = local_a50;
          if ((bVar52 & 1) == 0) {
            if ((bVar9 & 1) == 0) {
              local_a60 = (ASN1_GENERALIZEDTIME *)0x518362;
              pXVar27 = X509_get_subject_name(local_9e0);
              if (pXVar27 == (X509_NAME *)0x0) {
                iVar10 = -1;
              }
              else {
                iVar50 = -1;
                do {
                  iVar10 = iVar50;
                  iVar50 = X509_NAME_get_index_by_NID(pXVar27,0xd,iVar10);
                } while (-1 < iVar50);
              }
              CVar12 = CURLE_OK;
              bVar63 = true;
              if (-1 < iVar10) {
                ne = X509_NAME_get_entry(pXVar27,iVar10);
                pAVar31 = X509_NAME_ENTRY_get_data(ne);
                if (pAVar31 != (ASN1_STRING *)0x0) {
                  iVar10 = ASN1_STRING_type(pAVar31);
                  if (iVar10 == 0xc) {
                    uVar11 = ASN1_STRING_length(pAVar31);
                    if ((-1 < (int)uVar11) &&
                       (__dest = (ASN1_GENERALIZEDTIME *)
                                 CRYPTO_malloc(uVar11 + 1,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                               ,0x63e), local_a60 = __dest,
                       __dest != (ASN1_GENERALIZEDTIME *)0x0)) {
                      __src = (void *)ASN1_STRING_get0_data(pAVar31);
                      memcpy(__dest,__src,(ulong)uVar11);
                      *(undefined1 *)((long)&local_a60->length + (ulong)uVar11) = 0;
                    }
                  }
                  else {
                    uVar11 = ASN1_STRING_to_UTF8((uchar **)&local_a60,pAVar31);
                  }
                  if (local_a60 != (ASN1_GENERALIZEDTIME *)0x0) {
                    uznum = strlen((char *)local_a60);
                    uVar14 = curlx_uztosi(uznum);
                    if (uVar14 != uVar11) {
                      bVar63 = false;
                      Curl_failf(local_a50,"SSL: illegal cert name field");
                      CVar12 = CURLE_PEER_FAILED_VERIFICATION;
                    }
                  }
                }
              }
              pCVar56 = local_a10;
              if (local_a60 == (ASN1_GENERALIZEDTIME *)0x518362) {
                local_a60 = (ASN1_GENERALIZEDTIME *)0x0;
              }
              if (bVar63) {
                if (local_a60 == (ASN1_GENERALIZEDTIME *)0x0) {
                  Curl_failf(local_a50,"SSL: unable to obtain common name from peer certificate");
                }
                else {
                  iVar10 = Curl_cert_hostcheck((char *)local_a60,(char *)local_a08);
                  if (iVar10 != 0) {
                    CVar12 = CURLE_OK;
                    Curl_infof(local_a50," common name: %s (matched)\n");
                    goto LAB_0049b64b;
                  }
                  Curl_failf(local_a50,
                             "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                             ,local_a60,local_a00);
                }
                CVar12 = CURLE_PEER_FAILED_VERIFICATION;
              }
LAB_0049b64b:
              if (local_a60 != (ASN1_GENERALIZEDTIME *)0x0) {
                CRYPTO_free(local_a60);
              }
            }
            else {
              Curl_infof(local_a50," subjectAltName does not match %s\n",local_a00);
              Curl_failf(pCVar46,
                         "SSL: no alternative certificate subject name matches target host name \'%s\'"
                         ,uVar29);
              CVar12 = CURLE_PEER_FAILED_VERIFICATION;
            }
          }
          if (CVar12 == CURLE_OK) goto LAB_0049b66e;
LAB_0049b8fd:
          BIO_free(local_a40);
          X509_free((X509 *)(conn->ssl[lVar15].backend)->server_cert);
          (conn->ssl[lVar15].backend)->server_cert = (X509 *)0x0;
        }
        else {
          if ((conn->ssl_config).verifyhost == true) goto LAB_0049ac0d;
LAB_0049b66e:
          pXVar27 = X509_get_issuer_name((X509 *)(conn->ssl[lVar15].backend)->server_cert);
          iVar10 = x509_name_oneline((X509_NAME *)pXVar27,(char *)local_838,size_00);
          if (iVar10 == 0) {
            Curl_infof(pCVar56," issuer: %s\n",local_838);
            pBVar25 = local_a40;
            cVar3 = (conn->http_proxy).proxytype;
            if ((cVar3 == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              pcVar62 = (pCVar56->set).proxy_ssl.issuercert;
            }
            else {
              pcVar62 = (pCVar56->set).ssl.issuercert;
            }
            if (pcVar62 != (char *)0x0) {
              if ((cVar3 != CURLPROXY_HTTPS) ||
                 (lVar51 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar51 = 0xac0;
              }
              lVar51 = BIO_ctrl(local_a40,0x6c,3,*(void **)((long)pCVar56->sockets + lVar51 + -0x80)
                               );
              if ((int)lVar51 < 1) {
                if ((char)local_a30 != '\0') {
                  if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                     (lVar51 = 0xb70,
                     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                    lVar51 = 0xac0;
                  }
                  Curl_failf(pCVar56,"SSL: Unable to open issuer cert (%s)",
                             *(undefined8 *)((long)pCVar56->sockets + lVar51 + -0x80));
                }
                BIO_free(pBVar25);
              }
              else {
                pXVar26 = PEM_read_bio_X509(pBVar25,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
                pBVar25 = local_a40;
                if (pXVar26 == (X509 *)0x0) {
                  if ((char)local_a30 != '\0') {
                    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                       (lVar51 = 0xb70,
                       conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                      lVar51 = 0xac0;
                    }
                    Curl_failf(pCVar56,"SSL: Unable to read issuer cert (%s)",
                               *(undefined8 *)((long)pCVar56->sockets + lVar51 + -0x80));
                  }
                  BIO_free(pBVar25);
                  pXVar26 = (X509 *)0x0;
                }
                else {
                  iVar10 = X509_check_issued(pXVar26,(X509 *)(conn->ssl[lVar15].backend)->
                                                             server_cert);
                  if (iVar10 == 0) {
                    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                       (lVar51 = 0xb70,
                       conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                      lVar51 = 0xac0;
                    }
                    Curl_infof(pCVar56," SSL certificate issuer check ok (%s)\n",
                               *(undefined8 *)((long)pCVar56->sockets + lVar51 + -0x80));
                    X509_free(pXVar26);
                    goto LAB_0049bdd8;
                  }
                  if ((char)local_a30 != '\0') {
                    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                       (lVar51 = 0xb70,
                       conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                      lVar51 = 0xac0;
                    }
                    Curl_failf(pCVar56,"SSL: Certificate issuer check failed (%s)",
                               *(undefined8 *)((long)pCVar56->sockets + lVar51 + -0x80));
                  }
                  BIO_free(local_a40);
                }
                X509_free(pXVar26);
              }
              X509_free((X509 *)(conn->ssl[lVar15].backend)->server_cert);
              (conn->ssl[lVar15].backend)->server_cert = (X509 *)0x0;
              CVar12 = CURLE_SSL_ISSUER_ERROR;
              goto LAB_0049bd12;
            }
LAB_0049bdd8:
            lVar51 = SSL_get_verify_result((SSL *)(conn->ssl[lVar15].backend)->handle);
            *(long *)((long)pCVar56->sockets + local_9d8 + -0x80) = lVar51;
            if (lVar51 == 0) {
              CVar49 = CURLE_OK;
              Curl_infof(pCVar56," SSL certificate verify ok.\n");
            }
            else {
              if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
                 (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
                if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_0049be7f:
                  pcVar62 = X509_verify_cert_error_string(lVar51);
                  CVar49 = CURLE_OK;
                  Curl_infof(pCVar56,
                             " SSL certificate verify result: %s (%ld), continuing anyway.\n",
                             pcVar62,lVar51);
                  goto LAB_0049b6ac;
                }
              }
              else if ((conn->ssl_config).verifypeer != true) goto LAB_0049be7f;
              CVar49 = CURLE_PEER_FAILED_VERIFICATION;
              if ((char)local_a30 != '\0') {
                pcVar62 = X509_verify_cert_error_string(lVar51);
                Curl_failf(pCVar56,"SSL certificate verify result: %s (%ld)",pcVar62,lVar51);
              }
            }
          }
          else {
            CVar49 = CURLE_PEER_FAILED_VERIFICATION;
            if ((char)local_a30 != '\0') {
              Curl_failf(pCVar56,"SSL: couldn\'t get X509-issuer name!");
            }
          }
LAB_0049b6ac:
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_0049b74c:
              pCVar46 = conn->data;
              lVar51 = SSL_ctrl((SSL *)(conn->ssl[lVar15].backend)->handle,0x46,0,local_9b8);
              if (local_9b8[0] == (SSL_SESSION *)0x0) {
                pcVar62 = "No OCSP response received";
LAB_0049b8d0:
                pCVar38 = (Curl_easy *)0x0;
                Curl_failf(pCVar46,pcVar62);
                CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
                bs = (OCSP_BASICRESP *)0x0;
              }
              else {
                pCVar38 = (Curl_easy *)
                          d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)local_9b8,lVar51);
                if (pCVar38 == (Curl_easy *)0x0) {
                  pcVar62 = "Invalid OCSP response";
                  goto LAB_0049b8d0;
                }
                uVar11 = OCSP_response_status((OCSP_RESPONSE *)pCVar38);
                if (uVar11 == 0) {
                  bs = OCSP_response_get1_basic((OCSP_RESPONSE *)pCVar38);
                  if (bs == (OCSP_BASICRESP *)0x0) {
                    Curl_failf(pCVar46,"Invalid OCSP response");
                    goto LAB_0049b7cc;
                  }
                  psVar24 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar15].backend)->handle);
                  pXVar41 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar15].backend)->ctx);
                  CVar12 = CURLE_OK;
                  iVar10 = OCSP_basic_verify(bs,psVar24,pXVar41,0);
                  if (iVar10 < 1) {
                    Curl_failf(pCVar46,"OCSP response verification failed");
                    CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
                  }
                  else {
                    iVar10 = OCSP_resp_count(bs);
                    if (0 < iVar10) {
                      iVar10 = 0;
                      CVar12 = CURLE_OK;
                      local_a58 = pCVar38;
                      do {
                        single = OCSP_resp_get0(bs,iVar10);
                        if (single == (OCSP_SINGLERESP *)0x0) {
                          uVar11 = 5;
                        }
                        else {
                          uVar11 = OCSP_single_get0_status
                                             (single,(int *)&local_9e4,&local_a60,&local_a48,
                                              &local_9f0);
                          iVar50 = OCSP_check_validity(local_a48,local_9f0,300,-1);
                          if (iVar50 == 0) {
                            Curl_failf(pCVar46,"OCSP response has expired");
                            uVar11 = 2;
                            CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
                          }
                          else {
                            pcVar62 = OCSP_cert_status_str((long)(int)uVar11);
                            Curl_infof(pCVar46,"SSL certificate status: %s (%d)\n",pcVar62,
                                       (ulong)uVar11);
                            if (uVar11 != 2) {
                              if (uVar11 != 1) {
                                uVar11 = 0;
                                pCVar38 = local_a58;
                                goto LAB_0049bc05;
                              }
                              pcVar62 = OCSP_crl_reason_str((long)(int)local_9e4);
                              Curl_failf(pCVar46,"SSL certificate revocation reason: %s (%d)",
                                         pcVar62,(ulong)local_9e4);
                              uVar11 = 2;
                            }
                            CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
                            pCVar38 = local_a58;
                          }
                        }
LAB_0049bc05:
                        if ((uVar11 != 0) && (uVar11 != 5)) {
                          if (uVar11 != 2) goto LAB_0049b8f9;
                          break;
                        }
                        iVar10 = iVar10 + 1;
                        iVar50 = OCSP_resp_count(bs);
                      } while (iVar10 < iVar50);
                    }
                  }
                }
                else {
                  pcVar62 = OCSP_response_status_str((long)(int)uVar11);
                  Curl_failf(pCVar46,"Invalid OCSP response status: %s (%d)",pcVar62,(ulong)uVar11);
LAB_0049b7cc:
                  bs = (OCSP_BASICRESP *)0x0;
                  CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
                }
              }
              if (bs != (OCSP_BASICRESP *)0x0) {
                OCSP_BASICRESP_free(bs);
              }
              OCSP_RESPONSE_free((OCSP_RESPONSE *)pCVar38);
LAB_0049b8f9:
              if (CVar12 != CURLE_OK) goto LAB_0049b8fd;
              CVar49 = CURLE_OK;
            }
          }
          else if ((conn->ssl_config).verifystatus == true) goto LAB_0049b74c;
          CVar12 = CURLE_OK;
          if ((char)local_a30 != '\0') {
            CVar12 = CVar49;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar51 = 0xd70, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar51 = 0xd68;
          }
          pSVar22 = *(SSL_SESSION **)((long)pCVar56->sockets + lVar51 + -0x80);
          local_a20 = pSVar22;
          if (pSVar22 != (SSL_SESSION *)0x0 && CVar12 == CURLE_OK) {
            pXVar34 = (conn->ssl[lVar15].backend)->server_cert;
            local_9b8[0] = (SSL_SESSION *)0x0;
            if (pXVar34 == (X509 *)0x0) {
              CVar12 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
            }
            else {
              pXVar39 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar34);
              uVar11 = i2d_X509_PUBKEY(pXVar39,(uchar **)0x0);
              CVar12 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
              pSVar40 = (SSL_SESSION *)0x0;
              if (0 < (int)uVar11) {
                uVar17 = (ulong)uVar11;
                pSVar40 = (SSL_SESSION *)(*Curl_cmalloc)(uVar17);
                local_9b8[0] = pSVar40;
                if (pSVar40 == (SSL_SESSION *)0x0) {
                  pSVar40 = (SSL_SESSION *)0x0;
                }
                else {
                  pXVar39 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar34);
                  uVar14 = i2d_X509_PUBKEY(pXVar39,(uchar **)local_9b8);
                  if ((local_9b8[0] != (SSL_SESSION *)0x0 && uVar11 == uVar14) &&
                      (long)local_9b8[0] - (long)pSVar40 == uVar17) {
                    CVar12 = Curl_pin_peer_pubkey(pCVar56,(char *)pSVar22,(uchar *)pSVar40,uVar17);
                  }
                }
              }
              if (pSVar40 != (SSL_SESSION *)0x0) {
                (*Curl_cfree)(pSVar40);
              }
            }
            if (CVar12 == CURLE_OK) {
              CVar12 = CURLE_OK;
            }
            else {
              Curl_failf(pCVar56,"SSL: public key does not match pinned public key!");
            }
          }
          BIO_free(local_a40);
          X509_free((X509 *)(conn->ssl[lVar15].backend)->server_cert);
          (conn->ssl[lVar15].backend)->server_cert = (X509 *)0x0;
          conn->ssl[lVar15].connecting_state = ssl_connect_done;
        }
      }
    }
LAB_0049bd12:
    if (CVar12 == CURLE_OK) {
      conn->ssl[lVar15].connecting_state = ssl_connect_done;
    }
  }
  if (CVar12 != CURLE_OK) {
    return CVar12;
  }
LAB_0049bd27:
  bVar63 = conn->ssl[lVar15].connecting_state == ssl_connect_done;
  if (bVar63) {
    conn->ssl[lVar15].state = ssl_connection_complete;
    conn->recv[local_9d0] = ossl_recv;
    conn->send[local_9d0] = ossl_send;
  }
  *local_9c8 = bVar63;
  conn->ssl[lVar15].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}